

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O1

string * __thiscall
pbrt::Quaternion::ToString_abi_cxx11_(string *__return_storage_ptr__,Quaternion *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,"[ %f, %f, %f, %f ]",(float *)this,
             &(this->v).super_Tuple3<pbrt::Vector3,_float>.y,
             &(this->v).super_Tuple3<pbrt::Vector3,_float>.z,&this->w);
  return __return_storage_ptr__;
}

Assistant:

std::string Quaternion::ToString() const {
    return StringPrintf("[ %f, %f, %f, %f ]", v.x, v.y, v.z, w);
}